

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

void * __thiscall
kj::anon_unknown_9::DiskHandle::mmap
          (DiskHandle *this,void *__addr,size_t __len,int __prot,int __flags,int __fd,
          __off_t __offset)

{
  undefined8 *in_RAX;
  void *pvVar1;
  undefined4 in_register_0000000c;
  uint64_t size;
  MmapRange MVar2;
  Fault f;
  Fault local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  size = CONCAT44(in_register_0000000c,__prot);
  if (size == 0) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 2) = 0;
    *(undefined8 *)(this + 4) = 0;
  }
  else {
    MVar2 = getMmapRange(__len,size);
    pvVar1 = mmap64((void *)0x0,MVar2.size,1,1,*__addr,MVar2.offset);
    if (pvVar1 == (void *)0xffffffffffffffff) {
      __errno_location();
      local_40.exception = (Exception *)0x0;
      local_38 = 0;
      uStack_30 = 0;
      kj::_::Debug::Fault::init
                (&local_40,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_40);
    }
    *(size_t *)this = (long)pvVar1 + (__len - MVar2.offset);
    *(uint64_t *)(this + 2) = size;
    in_RAX = &(anonymous_namespace)::mmapDisposer;
    *(undefined8 **)(this + 4) = &(anonymous_namespace)::mmapDisposer;
  }
  return in_RAX;
}

Assistant:

Array<const byte> mmap(uint64_t offset, uint64_t size) const {
    if (size == 0) return nullptr;  // zero-length mmap() returns EINVAL, so avoid it
    auto range = getMmapRange(offset, size);
    const void* mapping = ::mmap(NULL, range.size, PROT_READ, MAP_SHARED, fd, range.offset);
    if (mapping == MAP_FAILED) {
      KJ_FAIL_SYSCALL("mmap", errno);
    }
    return Array<const byte>(reinterpret_cast<const byte*>(mapping) + (offset - range.offset),
                             size, mmapDisposer);
  }